

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O3

void __thiscall Clasp::SharedContext::~SharedContext(SharedContext *this)

{
  Solver *this_00;
  Minimize *pMVar1;
  pointer pMVar2;
  pointer ppSVar3;
  ulong uVar4;
  pointer pVVar5;
  pointer pVVar6;
  size_type sVar7;
  long *plVar8;
  
  sVar7 = (this->solvers_).ebo_.size;
  while (sVar7 != 0) {
    this_00 = (this->solvers_).ebo_.buf[sVar7 - 1];
    if (this_00 != (Solver *)0x0) {
      Solver::~Solver(this_00);
    }
    operator_delete(this_00);
    sVar7 = (this->solvers_).ebo_.size - 1;
    (this->solvers_).ebo_.size = sVar7;
  }
  pMVar1 = this->mini_;
  if (pMVar1 != (Minimize *)0x0) {
    SingleOwnerPtr<Clasp::SharedMinimizeData,_Clasp::ReleaseObject>::reset
              (&pMVar1->product,(SharedMinimizeData *)0x0);
    pMVar2 = (pMVar1->builder).lits_.ebo_.buf;
    if (pMVar2 != (pointer)0x0) {
      operator_delete(pMVar2);
    }
  }
  operator_delete(pMVar1);
  ppSVar3 = (this->solvers_).ebo_.buf;
  if (ppSVar3 != (pointer)0x0) {
    operator_delete(ppSVar3);
  }
  uVar4 = (this->config_).ptr_;
  plVar8 = (long *)(uVar4 & 0xfffffffffffffffe);
  if ((uVar4 & 1) != 0 && plVar8 != (long *)0x0) {
    (this->config_).ptr_ = (uintp)plVar8;
    (**(code **)(*plVar8 + 8))();
  }
  (this->config_).ptr_ = 1;
  ShortImplicationsGraph::~ShortImplicationsGraph(&this->btig_);
  pVVar5 = (this->varInfo_).ebo_.buf;
  if (pVVar5 != (pointer)0x0) {
    operator_delete(pVVar5);
  }
  uVar4 = (this->distributor).ptr_;
  plVar8 = (long *)(uVar4 & 0xfffffffffffffffe);
  if ((uVar4 & 1) != 0 && plVar8 != (long *)0x0) {
    (this->distributor).ptr_ = (uintp)plVar8;
    (**(code **)(*plVar8 + 8))();
  }
  (this->distributor).ptr_ = 1;
  pVVar6 = (this->heuristic).entries_.ebo_.buf;
  if (pVVar6 != (pointer)0x0) {
    operator_delete(pVVar6);
  }
  OutputTable::~OutputTable(&this->output);
  SingleOwnerPtr<Clasp::ExtDepGraph,_Clasp::DeleteObject>::reset(&this->extGraph,(ExtDepGraph *)0x0)
  ;
  SingleOwnerPtr<Clasp::Asp::PrgDepGraph,_Clasp::DeleteObject>::reset
            (&this->sccGraph,(PrgDepGraph *)0x0);
  uVar4 = (this->satPrepro).ptr_;
  plVar8 = (long *)(uVar4 & 0xfffffffffffffffe);
  if ((uVar4 & 1) != 0 && plVar8 != (long *)0x0) {
    (this->satPrepro).ptr_ = (uintp)plVar8;
    (**(code **)(*plVar8 + 8))();
  }
  (this->satPrepro).ptr_ = 1;
  return;
}

Assistant:

SharedContext::~SharedContext() {
	while (!solvers_.empty()) { delete solvers_.back(); solvers_.pop_back(); }
	delete mini_;
}